

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::
AdjustSequenceNumbering
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long size;
  TPZCompEl *pTVar3;
  undefined1 auVar4 [16];
  TPZCompEl **ppTVar5;
  TPZConnect *pTVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  long lVar9;
  long nelem;
  long lVar10;
  _Self __tmp;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  set<long,_std::less<long>,_std::allocator<long>_> indepconnects;
  set<long,_std::less<long>,_std::allocator<long>_> depconnects;
  TPZManVector<long,_10> permute;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_100;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d0;
  TPZManVector<long,_10> local_a0;
  
  size = (((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->fConnectVec).
         super_TPZChunkVector<TPZConnect,_10>.fNElements;
  TPZManVector<long,_10>::TPZManVector(&local_a0,size);
  (**(code **)(*(long *)(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + 0x78))
            ();
  auVar4 = _DAT_014f8350;
  if (0 < size) {
    lVar11 = size + -1;
    auVar12._8_4_ = (int)lVar11;
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_014f8350;
    auVar13 = _DAT_014f8340;
    do {
      auVar14 = auVar13 ^ auVar4;
      if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                  auVar12._4_4_ < auVar14._4_4_) & 1)) {
        local_a0.super_TPZVec<long>.fStore[uVar8] = uVar8;
      }
      if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
          auVar14._12_4_ <= auVar12._12_4_) {
        local_a0.super_TPZVec<long>.fStore[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar11 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar11 + 2;
    } while ((size + 1U & 0xfffffffffffffffe) != uVar8);
  }
  lVar11 = *(long *)&this->field_0xb8;
  if (lVar11 < 1) {
    lVar9 = 0;
  }
  else {
    p_Var1 = &local_100._M_impl.super__Rb_tree_header;
    lVar10 = 0;
    lVar9 = 0;
    do {
      nelem = (long)*(int *)(*(long *)&this->field_0xb0 + lVar10 * 4);
      if (-1 < nelem) {
        ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)
                              ->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
        pTVar3 = *ppTVar5;
        if (pTVar3 != (TPZCompEl *)0x0) {
          local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_d0._M_impl.super__Rb_tree_header._M_header;
          local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_100._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_100._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
          (**(code **)(*(long *)pTVar3 + 0x1d8))(pTVar3,&local_100,&local_d0);
          for (p_Var7 = local_100._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != p_Var1;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                               (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.
                                  fMesh)->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                                *(int64_t *)(p_Var7 + 1));
            iVar2 = pTVar6->fNElConnected;
            if (iVar2 == 1) {
              local_a0.super_TPZVec<long>.fStore[pTVar6->fSequenceNumber] = lVar9;
              lVar9 = lVar9 + 1;
            }
            pTVar6->fNElConnected = iVar2 + -1;
          }
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&local_d0);
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&local_100);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar11);
  }
  if (0 < size) {
    lVar11 = 0;
    do {
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                           fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar11);
      if (((-1 < pTVar6->fSequenceNumber) && (0 < pTVar6->fNElConnected)) &&
         (local_a0.super_TPZVec<long>.fStore[pTVar6->fSequenceNumber] < lVar9)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "void TPZFrontStructMatrix<TPZFrontNonSym<double>>::AdjustSequenceNumbering() [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixOR<STATE>]"
                   ,0x9e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," very fishy\n",0xc);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
                   ,0x1f5);
      }
      lVar11 = lVar11 + 1;
    } while (size != lVar11);
  }
  TPZCompMesh::Permute
            ((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,
             &local_a0.super_TPZVec<long>);
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AdjustSequenceNumbering()
{
	int64_t nconnect = this->fMesh->ConnectVec().NElements();
	TPZManVector<int64_t> permute(nconnect);
	this->fMesh->ComputeNodElCon();
	int64_t i;
	for(i=0; i<nconnect; i++)
	{
		permute[i] = i;
	}
	TPZCompEl *cel;
	int64_t nelem = fElementOrder.NElements();
	int64_t el;
	int64_t connectcount = 0;
	for(i=0; i<nelem; i++)
	{
		el = fElementOrder[i];
        if(el<0) continue;
		cel = this->fMesh->ElementVec()[el];
		if(!cel) continue;
		std::set<int64_t> indepconnects, depconnects;
		cel->BuildConnectList(indepconnects,depconnects);
		std::set<int64_t>::iterator it;
		for(it=indepconnects.begin(); it != indepconnects.end(); it++)
		{
			TPZConnect &nod = this->fMesh->ConnectVec()[*it];
			int nelcon = nod.NElConnected()-1;
			int64_t seqnum = nod.SequenceNumber();
			if(nelcon == 0) permute[seqnum]= connectcount++;
			nod.DecrementElConnected();
		}
	}
	for(i=0; i<nconnect; i++)
	{
		TPZConnect &nod = this->fMesh->ConnectVec()[i];
		if(nod.SequenceNumber() < 0 || nod.NElConnected() <= 0) continue;
		if(permute[nod.SequenceNumber()] < connectcount)
		{
			std::cout << __PRETTY_FUNCTION__ << " very fishy\n";
			DebugStop();
		}
	}
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " permutation " << permute;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	this->fMesh->Permute(permute);
}